

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O3

ostream * __thiscall
covenant::DFA<covenant::Sym>::print_dot(DFA<covenant::Sym> *this,ostream *o,string *label)

{
  Sym s;
  TerminalFactory *this_00;
  pointer pvVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  pointer pvVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  string local_50;
  
  print_dot::sfa_key = print_dot::sfa_key + 1;
  std::__ostream_insert<char,std::char_traits<char>>(o,"digraph ",8);
  std::__ostream_insert<char,std::char_traits<char>>(o,"sfa_",4);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"label = \"",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(label->_M_dataplus)._M_p,label->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\";",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"rankdir=LR;",0xb);
  cVar2 = (char)o;
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"node [shape = point ] qi;",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (0 < (int)((ulong)((long)(this->trans).
                              super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->trans).
                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    uVar9 = 0;
    do {
      if (((this->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >>
           (uVar9 & 0x3f) & 1) == 0) {
        lVar7 = 0x17;
        pcVar8 = "node [shape = circle ] ";
      }
      else {
        lVar7 = 0x1d;
        pcVar8 = "node [shape = doublecircle ] ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar8,lVar7);
      std::__ostream_insert<char,std::char_traits<char>>(o,"q",1);
      poVar4 = (ostream *)std::ostream::operator<<(o,(int)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
      iVar3 = (int)((ulong)((long)(this->trans).
                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->trans).
                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(uVar10,iVar3 * -0x55555555) != (int)(uVar10 + iVar3 * 0x55555555) < 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"qi",2);
  std::__ostream_insert<char,std::char_traits<char>>(o," -> ",4);
  std::__ostream_insert<char,std::char_traits<char>>(o,"q",1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pvVar5 = (this->trans).
           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->trans).
      super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    uVar9 = 0;
    do {
      if (pvVar5[uVar9].
          super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          pvVar5[uVar9].
          super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 1;
        uVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(o,"q",1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"q",1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," [label=\"",9);
          s.x = *(int *)(*(long *)&(this->trans).
                                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                   super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                   ._M_impl.super__Vector_impl_data + uVar6 * 8);
          if ((s.x & 1U) == 0) {
            this_00 = (this->_tfac).px;
            if (this_00 == (TerminalFactory *)0x0) {
              __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                            "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<covenant::TerminalFactory>::operator->() const [T = covenant::TerminalFactory]"
                           );
            }
            TerminalFactory::remap_abi_cxx11_(&local_50,this_00,(long)(s.x >> 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      (o,local_50._M_dataplus._M_p,local_50._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          else {
            operator<<(o,s);
          }
          std::__ostream_insert<char,std::char_traits<char>>(o,"\"];",3);
          std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          pvVar5 = (this->trans).
                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
        } while (uVar6 < (ulong)((long)pvVar5[uVar9].
                                       super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)pvVar5[uVar9].
                                       super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pvVar1 = (this->eps).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar1[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 1;
        uVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(o,"q",1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"q",1);
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (poVar4,*(int *)(*(long *)&(this->eps).
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + uVar6 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," [label=e];",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          pvVar1 = (this->eps).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
        } while (uVar6 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar9].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar9].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data >> 2));
        pvVar5 = (this->trans).
                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar6 = ((long)(this->trans).
                     super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
              -0x5555555555555555;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return o;
}

Assistant:

ostream& print_dot(ostream& o, string label) const
    {
      static unsigned int sfa_key=0;
      sfa_key++;
      o << "digraph " << "sfa_" << sfa_key << "{" << endl;
      o << "label = \"" << label << "\";" << endl;
      o << "rankdir=LR;" << endl;
      o << "node [shape = point ] qi;" << endl;
      for (int i=0; i < nStates() ; i++)
      {
        if (accepts[i])
          o << "node [shape = doublecircle ] " << "q" << i << ";" << endl;
        else
          o << "node [shape = circle ] " << "q" << i << ";" << endl;
      }
      o << "qi" << " -> " << "q" << startState().id << endl;
      for( unsigned int ss = 0; ss < trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < trans[ss].size(); ti++ )
        {
          o << "q" << ss << " -> " << "q" << trans[ss][ti].dest 
            << " [label=\"";
          if (trans[ss][ti].val.isVar ())
            o << trans[ss][ti].val; 
          else
            o << _tfac->remap (trans[ss][ti].val.symID ());
          o << "\"];" << endl;
        }
        for(unsigned int ei = 0; ei < eps[ss].size(); ei++)
        {
          o << "q" << ss << " -> " << "q" << eps[ss][ei] 
            << " [label=e];" << endl;
        }
      }
      o << "}" << endl;
      return o;
    }